

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  char *pcVar1;
  size_t sVar2;
  ClientHook *pCVar3;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  unsigned_long *in_R9;
  Promise<void> PVar5;
  String local_1a8;
  _func_int **local_190;
  ClientHook *pCStack_188;
  char *local_180;
  uint64_t local_178;
  Exception local_170;
  
  local_178 = requestedTypeId;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            (&local_1a8,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&local_178,&local_180,in_R9);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x4b,&local_1a8);
  kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_190,&local_170);
  pCVar3 = pCStack_188;
  pCStack_188 = (ClientHook *)0x0;
  this->_vptr_Server = local_190;
  this->thisHook = pCVar3;
  kj::Exception::~Exception(&local_170);
  sVar2 = local_1a8.content.size_;
  pcVar1 = local_1a8.content.ptr;
  pPVar4 = extraout_RDX;
  if (local_1a8.content.ptr != (char *)0x0) {
    local_1a8.content.ptr = (char *)0x0;
    local_1a8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1a8.content.disposer)
              (local_1a8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                      actualInterfaceName, requestedTypeId);
}